

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::verifyShader
               (NegativeTestContext *ctx,ShaderType shaderType,string *shaderSource,
               ExpectResult expect)

{
  ostringstream *this;
  TestLog *log;
  int length;
  string message;
  char *source;
  Shader shader;
  undefined1 local_1b0 [384];
  
  log = (ctx->super_CallLogWrapper).m_log;
  source = (shaderSource->_M_dataplus)._M_p;
  length = (int)shaderSource->_M_string_length;
  glu::Shader::Shader(&shader,ctx->m_renderCtx,shaderType);
  message._M_dataplus._M_p = (pointer)&message.field_2;
  message._M_string_length = 0;
  message.field_2._M_local_buf[0] = '\0';
  glu::Shader::setSources(&shader,1,&source,&length);
  glu::Shader::compile(&shader);
  glu::operator<<(log,&shader);
  if (expect == EXPECT_RESULT_PASS) {
    std::__cxx11::string::assign((char *)&message);
    shader.m_info.compileOk = (bool)(shader.m_info.compileOk ^ 1);
  }
  else {
    std::__cxx11::string::assign((char *)&message);
  }
  if (shader.m_info.compileOk != false) {
    this = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,(string *)&message);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    NegativeTestContext::fail(ctx,&message);
  }
  std::__cxx11::string::~string((string *)&message);
  glu::Shader::~Shader(&shader);
  return;
}

Assistant:

void verifyShader(NegativeTestContext& ctx, glu::ShaderType shaderType, std::string shaderSource, ExpectResult expect)
{
	DE_ASSERT(expect >= EXPECT_RESULT_PASS && expect < EXPECT_RESULT_LAST);

	tcu::TestLog&		log			= ctx.getLog();
	bool				testFailed	= false;
	const char* const	source		= shaderSource.c_str();
	const int			length		= (int) shaderSource.size();
	glu::Shader			shader		(ctx.getRenderContext(), shaderType);
	std::string			message;

	shader.setSources(1, &source, &length);
	shader.compile();

	log << shader;

	if (expect == EXPECT_RESULT_PASS)
	{
		testFailed = !shader.getCompileStatus();
		message = "Shader did not compile.";
	}
	else
	{
		testFailed = shader.getCompileStatus();
		message = "Shader was not expected to compile.";
	}

	if (testFailed)
	{
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
		ctx.fail(message);
	}
}